

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pcVar6;
  string *psVar7;
  ulong uVar8;
  int local_1c7c;
  string local_1a58 [32];
  undefined1 local_1a38 [8];
  ostringstream cmCTestLog_msg_9;
  string local_18c0 [32];
  undefined1 local_18a0 [8];
  ostringstream cmCTestLog_msg_8;
  allocator<char> local_1721;
  string local_1720;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1700;
  duration<long,_std::ratio<1L,_1000000000L>_> local_16f8;
  duration<long,_std::ratio<60L,_1L>_> local_16f0;
  rep local_16e8;
  allocator<char> local_16d9;
  string local_16d8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_16b8;
  allocator<char> local_16a9;
  string local_16a8;
  allocator<char> local_1681;
  string local_1680;
  undefined1 local_1660 [8];
  string end_time;
  undefined1 local_1620 [8];
  ostringstream cmCTestLog_msg_7;
  string local_14a8 [32];
  undefined1 local_1488 [8];
  ostringstream cmCTestLog_msg_6;
  string local_1308 [4];
  int numConflicting;
  undefined1 local_12e8 [8];
  ostringstream cmCTestLog_msg_5;
  string local_1168 [4];
  int numModified;
  undefined1 local_1148 [8];
  ostringstream cmCTestLog_msg_4;
  int local_fc8;
  int numUpdated;
  int localModifications;
  bool loadedMods;
  allocator<char> local_f99;
  string local_f98;
  undefined1 local_f78 [8];
  string changeId;
  allocator<char> local_f49;
  string local_f48;
  allocator<char> local_f21;
  string local_f20;
  allocator<char> local_ef9;
  string local_ef8;
  allocator<char> local_ed1;
  string local_ed0;
  string local_eb0;
  string local_e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  allocator<char> local_e29;
  string local_e28;
  allocator<char> local_e01;
  string local_e00;
  allocator<char> local_dd9;
  string local_dd8;
  string local_db8;
  allocator<char> local_d91;
  string local_d90;
  allocator<char> local_d69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  allocator<char> local_d21;
  string local_d20;
  undefined1 local_d00 [8];
  cmXMLWriter xml;
  string local_ca0;
  string local_c80;
  undefined1 local_c60 [8];
  string buildname;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_c38;
  bool updated;
  time_point elapsed_time_start;
  time_point start_time_time;
  string start_time;
  undefined1 local_be8 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_a70 [8];
  cmGeneratedFileStream os;
  unique_ptr<cmCTestP4,_std::default_delete<cmCTestP4>_> local_800;
  unique_ptr<cmCTestHG,_std::default_delete<cmCTestHG>_> local_7f8;
  unique_ptr<cmCTestGIT,_std::default_delete<cmCTestGIT>_> local_7f0;
  unique_ptr<cmCTestBZR,_std::default_delete<cmCTestBZR>_> local_7e8;
  unique_ptr<cmCTestSVN,_std::default_delete<cmCTestSVN>_> local_7e0;
  unique_ptr<cmCTestCVS,_std::default_delete<cmCTestCVS>_> local_7d8;
  unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_> local_7d0;
  unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_> vc;
  undefined1 local_7a8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_630 [32];
  string *local_610;
  undefined1 local_608 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_490 [8];
  cmGeneratedFileStream ofs;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_71;
  string local_70;
  cmValue local_50;
  cmValue sourceDirectory;
  cmCLocaleEnvironmentScope fixLocale;
  cmCTestUpdateHandler *this_local;
  
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope
            ((cmCLocaleEnvironmentScope *)&sourceDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"SourceDirectory",&local_71);
  local_50 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar2 = cmValue::operator_cast_to_bool(&local_50);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_490,None);
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (!bVar2) {
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"Update",(cmGeneratedFileStream *)local_490);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    poVar4 = std::operator<<((ostream *)local_608,"   Updating the repository: ");
    local_610 = local_50.Value;
    poVar4 = ::operator<<(poVar4,local_50);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x80,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_630);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
    bVar2 = SelectVCS(this);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7a8);
      poVar4 = std::operator<<((ostream *)local_7a8,"   Use ");
      pcVar5 = cmCTestUpdateHandlerUpdateToString(this->UpdateType);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," repository type");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0x8a,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&vc);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7a8);
      std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::
      unique_ptr<std::default_delete<cmCTestVC>,void>
                ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7d0);
      switch(this->UpdateType) {
      case 1:
        std::make_unique<cmCTestCVS,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7d8,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7d0,&local_7d8);
        std::unique_ptr<cmCTestCVS,_std::default_delete<cmCTestCVS>_>::~unique_ptr(&local_7d8);
        break;
      case 2:
        std::make_unique<cmCTestSVN,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7e0,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7d0,&local_7e0);
        std::unique_ptr<cmCTestSVN,_std::default_delete<cmCTestSVN>_>::~unique_ptr(&local_7e0);
        break;
      case 3:
        std::make_unique<cmCTestBZR,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7e8,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7d0,&local_7e8);
        std::unique_ptr<cmCTestBZR,_std::default_delete<cmCTestBZR>_>::~unique_ptr(&local_7e8);
        break;
      case 4:
        std::make_unique<cmCTestGIT,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7f0,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7d0,&local_7f0);
        std::unique_ptr<cmCTestGIT,_std::default_delete<cmCTestGIT>_>::~unique_ptr(&local_7f0);
        break;
      case 5:
        std::make_unique<cmCTestHG,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7f8,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7d0,&local_7f8);
        std::unique_ptr<cmCTestHG,_std::default_delete<cmCTestHG>_>::~unique_ptr(&local_7f8);
        break;
      case 6:
        std::make_unique<cmCTestP4,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_800,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7d0,&local_800);
        std::unique_ptr<cmCTestP4,_std::default_delete<cmCTestP4>_>::~unique_ptr(&local_800);
        break;
      default:
        std::make_unique<cmCTestVC,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os.field_0x260,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator=
                  (&local_7d0,
                   (unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_> *)&os.field_0x260);
        std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::~unique_ptr
                  ((unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_> *)&os.field_0x260);
      }
      pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0);
      cmCTestVC::SetCommandLineTool(pcVar6,&this->UpdateCommand);
      pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0);
      psVar7 = cmValue::operator_cast_to_string_(&local_50);
      cmCTestVC::SetSourceDirectory(pcVar6,psVar7);
      pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0);
      cmCTestVC::Cleanup(pcVar6);
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_a70,None);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartUpdate,"Update",
                         (cmGeneratedFileStream *)local_a70);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)&start_time_time,(this->super_cmCTestGenericHandler).CTest);
        elapsed_time_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        tStack_c38.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0)
        ;
        buildname.field_2._M_local_buf[0xf] = cmCTestVC::Update(pcVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ca0,"BuildName",(allocator<char> *)&xml.field_0x57);
        cmCTest::GetCTestConfiguration(&local_c80,pcVar1,&local_ca0);
        cmCTest::SafeBuildIdField((string *)local_c60,&local_c80);
        std::__cxx11::string::~string((string *)&local_c80);
        std::__cxx11::string::~string((string *)&local_ca0);
        std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
        cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_d00,(ostream *)local_a70,0);
        cmXMLWriter::StartDocument((cmXMLWriter *)local_d00,"UTF-8");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d20,"Update",&local_d21)
        ;
        cmXMLWriter::StartElement((cmXMLWriter *)local_d00,&local_d20);
        std::__cxx11::string::~string((string *)&local_d20);
        std::allocator<char>::~allocator(&local_d21);
        cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_d00,"mode",(char (*) [7])0xd1a9bd);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d68,"ctest-",&local_d69)
        ;
        pcVar5 = cmVersion::GetCMakeVersion();
        std::operator+(&local_d48,&local_d68,pcVar5);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  ((cmXMLWriter *)local_d00,"Generator",&local_d48);
        std::__cxx11::string::~string((string *)&local_d48);
        std::__cxx11::string::~string((string *)&local_d68);
        std::allocator<char>::~allocator(&local_d69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d90,"Site",&local_d91);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd8,"Site",&local_dd9);
        cmCTest::GetCTestConfiguration(&local_db8,pcVar1,&local_dd8);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_d00,&local_d90,&local_db8);
        std::__cxx11::string::~string((string *)&local_db8);
        std::__cxx11::string::~string((string *)&local_dd8);
        std::allocator<char>::~allocator(&local_dd9);
        std::__cxx11::string::~string((string *)&local_d90);
        std::allocator<char>::~allocator(&local_d91);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e00,"BuildName",&local_e01);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_d00,&local_e00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c60);
        std::__cxx11::string::~string((string *)&local_e00);
        std::allocator<char>::~allocator(&local_e01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e28,"BuildStamp",&local_e29);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_e90,(this->super_cmCTestGenericHandler).CTest);
        std::operator+(&local_e70,&local_e90,"-");
        cmCTest::GetTestModelString_abi_cxx11_(&local_eb0,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::operator+(&local_e50,&local_e70,&local_eb0);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_d00,&local_e28,&local_e50);
        std::__cxx11::string::~string((string *)&local_e50);
        std::__cxx11::string::~string((string *)&local_eb0);
        std::__cxx11::string::~string((string *)&local_e70);
        std::__cxx11::string::~string((string *)&local_e90);
        std::__cxx11::string::~string((string *)&local_e28);
        std::allocator<char>::~allocator(&local_e29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ed0,"StartDateTime",&local_ed1);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_d00,&local_ed0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &start_time_time);
        std::__cxx11::string::~string((string *)&local_ed0);
        std::allocator<char>::~allocator(&local_ed1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ef8,"StartTime",&local_ef9);
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((cmXMLWriter *)local_d00,&local_ef8,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&elapsed_time_start);
        std::__cxx11::string::~string((string *)&local_ef8);
        std::allocator<char>::~allocator(&local_ef9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f20,"UpdateCommand",&local_f21);
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0)
        ;
        psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_d00,&local_f20,psVar7);
        std::__cxx11::string::~string((string *)&local_f20);
        std::allocator<char>::~allocator(&local_f21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f48,"UpdateType",&local_f49);
        changeId.field_2._8_8_ = cmCTestUpdateHandlerUpdateToString(this->UpdateType);
        cmXMLWriter::Element<char_const*>
                  ((cmXMLWriter *)local_d00,&local_f48,(char **)((long)&changeId.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_f48);
        std::allocator<char>::~allocator(&local_f49);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f98,"ChangeId",&local_f99);
        cmCTest::GetCTestConfiguration((string *)local_f78,pcVar1,&local_f98);
        std::__cxx11::string::~string((string *)&local_f98);
        std::allocator<char>::~allocator(&local_f99);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&localModifications,"ChangeId",
                     (allocator<char> *)((long)&numUpdated + 3));
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_d00,(string *)&localModifications,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f78)
          ;
          std::__cxx11::string::~string((string *)&localModifications);
          std::allocator<char>::~allocator((allocator<char> *)((long)&numUpdated + 3));
        }
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0)
        ;
        numUpdated._2_1_ = cmCTestVC::WriteXML(pcVar6,(cmXMLWriter *)local_d00);
        local_fc8 = 0;
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0)
        ;
        local_1c7c = cmCTestVC::GetPathCount(pcVar6,PathUpdated);
        if (local_1c7c != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1148);
          poVar4 = std::operator<<((ostream *)local_1148,"   Found ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c7c);
          std::operator<<(poVar4," updated files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd8,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1168);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1148);
        }
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0)
        ;
        iVar3 = cmCTestVC::GetPathCount(pcVar6,PathModified);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12e8);
          poVar4 = std::operator<<((ostream *)local_12e8,"   Found ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
          std::operator<<(poVar4," locally modified files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xdd,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1308);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12e8);
          local_fc8 = iVar3;
        }
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7d0)
        ;
        iVar3 = cmCTestVC::GetPathCount(pcVar6,PathConflicting);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1488);
          poVar4 = std::operator<<((ostream *)local_1488,"   Found ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
          std::operator<<(poVar4," conflicting files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xe3,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_14a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1488);
          local_fc8 = iVar3 + local_fc8;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1620);
        poVar4 = std::operator<<((ostream *)local_1620,"End");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xe7,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(end_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1620);
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_1660,(this->super_cmCTestGenericHandler).CTest);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1680,"EndDateTime",&local_1681);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_d00,&local_1680,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1660);
        std::__cxx11::string::~string((string *)&local_1680);
        std::allocator<char>::~allocator(&local_1681);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_16a8,"EndTime",&local_16a9);
        local_16b8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((cmXMLWriter *)local_d00,&local_16a8,&local_16b8);
        std::__cxx11::string::~string((string *)&local_16a8);
        std::allocator<char>::~allocator(&local_16a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_16d8,"ElapsedMinutes",&local_16d9);
        local_1700.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        local_16f8.__r = (rep)std::chrono::operator-(&local_1700,&stack0xfffffffffffff3c8);
        local_16f0.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                            (&local_16f8);
        local_16e8 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_16f0);
        cmXMLWriter::Element<long>((cmXMLWriter *)local_d00,&local_16d8,&local_16e8);
        std::__cxx11::string::~string((string *)&local_16d8);
        std::allocator<char>::~allocator(&local_16d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1720,"UpdateReturnStatus",&local_1721);
        cmXMLWriter::StartElement((cmXMLWriter *)local_d00,&local_1720);
        std::__cxx11::string::~string((string *)&local_1720);
        std::allocator<char>::~allocator(&local_1721);
        if (local_fc8 != 0) {
          cmXMLWriter::Content<char[72]>
                    ((cmXMLWriter *)local_d00,
                     (char (*) [72])
                     "Update error: There are modified or conflicting files in the repository");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18a0);
          poVar4 = std::operator<<((ostream *)local_18a0,
                                   "   There are modified or conflicting files in the repository");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xf6,pcVar5,false);
          std::__cxx11::string::~string(local_18c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18a0);
        }
        if ((buildname.field_2._M_local_buf[0xf] & 1U) == 0) {
          cmXMLWriter::Content<char[24]>
                    ((cmXMLWriter *)local_d00,(char (*) [24])"Update command failed:\n");
          pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->
                             (&local_7d0);
          psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_d00,psVar7);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a38);
          poVar4 = std::operator<<((ostream *)local_1a38,"   Update command failed: ");
          pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->
                             (&local_7d0);
          psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
          poVar4 = std::operator<<(poVar4,(string *)psVar7);
          std::operator<<(poVar4,"\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xfd,pcVar5,false);
          std::__cxx11::string::~string(local_1a58);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a38);
        }
        cmXMLWriter::EndElement((cmXMLWriter *)local_d00);
        cmXMLWriter::EndElement((cmXMLWriter *)local_d00);
        cmXMLWriter::EndDocument((cmXMLWriter *)local_d00);
        if (((buildname.field_2._M_local_buf[0xf] & 1U) == 0) || ((numUpdated._2_1_ & 1) == 0)) {
          local_1c7c = -1;
        }
        this_local._4_4_ = local_1c7c;
        ofs._612_4_ = 1;
        std::__cxx11::string::~string((string *)local_1660);
        std::__cxx11::string::~string((string *)local_f78);
        cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_d00);
        std::__cxx11::string::~string((string *)local_c60);
        std::__cxx11::string::~string((string *)&start_time_time);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_be8);
        poVar4 = std::operator<<((ostream *)local_be8,"Cannot open log file");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xb1,pcVar5,false);
        std::__cxx11::string::~string((string *)(start_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_be8);
        this_local._4_4_ = -1;
        ofs._612_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_a70);
      std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::~unique_ptr(&local_7d0);
    }
    else {
      this_local._4_4_ = -1;
      ofs._612_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_490);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar4 = std::operator<<((ostream *)local_200,
                             "Cannot find SourceDirectory  key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x74,pcVar5,false);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    this_local._4_4_ = -1;
    ofs._612_4_ = 1;
  }
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope
            ((cmCLocaleEnvironmentScope *)&sourceDirectory);
  return this_local._4_4_;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  cmValue sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  std::unique_ptr<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc = cm::make_unique<cmCTestCVS>(this->CTest, ofs);
      break;
    case e_SVN:
      vc = cm::make_unique<cmCTestSVN>(this->CTest, ofs);
      break;
    case e_BZR:
      vc = cm::make_unique<cmCTestBZR>(this->CTest, ofs);
      break;
    case e_GIT:
      vc = cm::make_unique<cmCTestGIT>(this->CTest, ofs);
      break;
    case e_HG:
      vc = cm::make_unique<cmCTestHG>(this->CTest, ofs);
      break;
    case e_P4:
      vc = cm::make_unique<cmCTestP4>(this->CTest, ofs);
      break;
    default:
      vc = cm::make_unique<cmCTestVC>(this->CTest, ofs);
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file" << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  auto start_time_time = std::chrono::system_clock::now();
  auto elapsed_time_start = std::chrono::steady_clock::now();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp",
              this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));
  std::string changeId = this->CTest->GetCTestConfiguration("ChangeId");
  if (!changeId.empty()) {
    xml.Element("ChangeId", changeId);
  }

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      "   Found " << numModified << " locally modified files\n", this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, WARNING,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Update command failed: " << vc->GetUpdateCommandLine()
                                            << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}